

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderColorRectWithAlphaCheckerboard
               (ImDrawList *draw_list,ImVec2 p_min,ImVec2 p_max,ImU32 col,float grid_step,
               ImVec2 grid_off,float rounding,ImDrawFlags flags)

{
  byte bVar1;
  ImU32 IVar2;
  uint in_EDX;
  uint in_ESI;
  float in_XMM0_Da;
  float _y;
  float _y_00;
  float v;
  float _x;
  float _x_00;
  float in_XMM0_Db;
  float in_XMM1_Da;
  float in_XMM1_Db;
  float in_XMM2_Da;
  undefined8 in_XMM3_Qa;
  ImDrawFlags cell_flags;
  float x2;
  float x1;
  float x;
  float y2;
  float y1;
  float y;
  int yi;
  ImU32 col_bg2;
  ImU32 col_bg1;
  ImU32 in_stack_ffffffffffffff90;
  ImU32 in_stack_ffffffffffffff94;
  float in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  ImVec2 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar3;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  float local_40;
  uint local_30;
  float local_18;
  float fStack_14;
  
  local_30 = in_EDX;
  if ((in_EDX & 0x1f0) == 0) {
    local_30 = 0xf0;
  }
  if (in_ESI >> 0x18 < 0xff) {
    IVar2 = ImAlphaBlendColors(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
    GetColorU32(IVar2,1.0);
    IVar2 = ImAlphaBlendColors(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
    GetColorU32(IVar2,1.0);
    ImDrawList::AddRectFilled
              ((ImDrawList *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (ImVec2 *)in_stack_ffffffffffffffa0,(ImU32)in_stack_ffffffffffffff9c,
               in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    bVar1 = 0;
    fStack_14 = (float)((ulong)in_XMM3_Qa >> 0x20);
    for (local_40 = in_XMM0_Db + fStack_14; local_40 < in_XMM1_Db; local_40 = in_XMM2_Da + local_40)
    {
      _y = ImClamp<float>(local_40,in_XMM0_Db,in_XMM1_Db);
      _y_00 = ImMin<float>(local_40 + in_XMM2_Da,in_XMM1_Db);
      if (_y < _y_00) {
        local_18 = (float)in_XMM3_Qa;
        for (v = (float)bVar1 * in_XMM2_Da + in_XMM0_Da + local_18; v < in_XMM1_Da;
            v = in_XMM2_Da + in_XMM2_Da + v) {
          _x = ImClamp<float>(v,in_XMM0_Da,in_XMM1_Da);
          _x_00 = ImMin<float>(v + in_XMM2_Da,in_XMM1_Da);
          if (_x < _x_00) {
            uVar3 = 0x100;
            if (_y <= in_XMM0_Db) {
              if (_x <= in_XMM0_Da) {
                uVar3 = 0x110;
              }
              if (in_XMM1_Da <= _x_00) {
                uVar3 = uVar3 | 0x20;
              }
            }
            if (in_XMM1_Db <= _y_00) {
              if (_x <= in_XMM0_Da) {
                uVar3 = uVar3 | 0x40;
              }
              if (in_XMM1_Da <= _x_00) {
                uVar3 = uVar3 | 0x80;
              }
            }
            if ((local_30 == 0x100) || (uVar3 == 0x100)) {
              uVar3 = 0x100;
            }
            else {
              uVar3 = uVar3 & local_30;
            }
            uVar4 = uVar3;
            ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa0,_x,_y);
            ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff98,_x_00,_y_00);
            ImDrawList::AddRectFilled
                      ((ImDrawList *)CONCAT44(v,_x),(ImVec2 *)CONCAT44(_x_00,uVar4),
                       (ImVec2 *)in_stack_ffffffffffffffa0,(ImU32)in_stack_ffffffffffffff9c,
                       in_stack_ffffffffffffff98,uVar3);
          }
        }
      }
      bVar1 = bVar1 ^ 1;
    }
  }
  else {
    ImDrawList::AddRectFilled
              ((ImDrawList *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (ImVec2 *)in_stack_ffffffffffffffa0,(ImU32)in_stack_ffffffffffffff9c,
               in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  }
  return;
}

Assistant:

void ImGui::RenderColorRectWithAlphaCheckerboard(ImDrawList* draw_list, ImVec2 p_min, ImVec2 p_max, ImU32 col, float grid_step, ImVec2 grid_off, float rounding, ImDrawFlags flags)
{
    if ((flags & ImDrawFlags_RoundCornersMask_) == 0)
        flags = ImDrawFlags_RoundCornersDefault_;
    if (((col & IM_COL32_A_MASK) >> IM_COL32_A_SHIFT) < 0xFF)
    {
        ImU32 col_bg1 = GetColorU32(ImAlphaBlendColors(IM_COL32(204, 204, 204, 255), col));
        ImU32 col_bg2 = GetColorU32(ImAlphaBlendColors(IM_COL32(128, 128, 128, 255), col));
        draw_list->AddRectFilled(p_min, p_max, col_bg1, rounding, flags);

        int yi = 0;
        for (float y = p_min.y + grid_off.y; y < p_max.y; y += grid_step, yi++)
        {
            float y1 = ImClamp(y, p_min.y, p_max.y), y2 = ImMin(y + grid_step, p_max.y);
            if (y2 <= y1)
                continue;
            for (float x = p_min.x + grid_off.x + (yi & 1) * grid_step; x < p_max.x; x += grid_step * 2.0f)
            {
                float x1 = ImClamp(x, p_min.x, p_max.x), x2 = ImMin(x + grid_step, p_max.x);
                if (x2 <= x1)
                    continue;
                ImDrawFlags cell_flags = ImDrawFlags_RoundCornersNone;
                if (y1 <= p_min.y) { if (x1 <= p_min.x) cell_flags |= ImDrawFlags_RoundCornersTopLeft; if (x2 >= p_max.x) cell_flags |= ImDrawFlags_RoundCornersTopRight; }
                if (y2 >= p_max.y) { if (x1 <= p_min.x) cell_flags |= ImDrawFlags_RoundCornersBottomLeft; if (x2 >= p_max.x) cell_flags |= ImDrawFlags_RoundCornersBottomRight; }

                // Combine flags
                cell_flags = (flags == ImDrawFlags_RoundCornersNone || cell_flags == ImDrawFlags_RoundCornersNone) ? ImDrawFlags_RoundCornersNone : (cell_flags & flags);
                draw_list->AddRectFilled(ImVec2(x1, y1), ImVec2(x2, y2), col_bg2, rounding, cell_flags);
            }
        }
    }
    else
    {
        draw_list->AddRectFilled(p_min, p_max, col, rounding, flags);
    }
}